

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::CheckboxFlagsT<int>(char *label,int *flags,int flags_value)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint uVar4;
  bool all_on;
  bool local_21;
  
  pIVar2 = GImGui;
  uVar4 = *flags & flags_value;
  if (uVar4 != 0 && uVar4 != flags_value) {
    uVar1 = GImGui->CurrentItemFlags;
    GImGui->CurrentItemFlags = uVar1 | 0x40;
    bVar3 = Checkbox(label,&local_21);
    pIVar2->CurrentItemFlags = uVar1;
  }
  else {
    bVar3 = Checkbox(label,&local_21);
  }
  if (bVar3 != false) {
    if (uVar4 != flags_value) {
      uVar4 = ~flags_value & *flags;
    }
    else {
      uVar4 = flags_value | *flags;
    }
    *flags = uVar4;
  }
  return bVar3;
}

Assistant:

bool ImGui::CheckboxFlagsT(const char* label, T* flags, T flags_value)
{
    bool all_on = (*flags & flags_value) == flags_value;
    bool any_on = (*flags & flags_value) != 0;
    bool pressed;
    if (!all_on && any_on)
    {
        ImGuiContext& g = *GImGui;
        ImGuiItemFlags backup_item_flags = g.CurrentItemFlags;
        g.CurrentItemFlags |= ImGuiItemFlags_MixedValue;
        pressed = Checkbox(label, &all_on);
        g.CurrentItemFlags = backup_item_flags;
    }
    else
    {
        pressed = Checkbox(label, &all_on);

    }
    if (pressed)
    {
        if (all_on)
            *flags |= flags_value;
        else
            *flags &= ~flags_value;
    }
    return pressed;
}